

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

ssl_ticket_aead_result_t __thiscall
bssl::decrypt_ticket_with_cipher_ctx
          (bssl *this,Array<unsigned_char> *out,EVP_CIPHER_CTX *cipher_ctx,HMAC_CTX *hmac_ctx,
          Span<const_unsigned_char> ticket)

{
  HMAC_CTX *pHVar1;
  bssl *pbVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uchar *len;
  ssl_ticket_aead_result_t sVar6;
  ulong len_00;
  ulong new_size;
  uchar *puVar7;
  ulong uVar8;
  int len1;
  int len2;
  uint8_t mac [64];
  int local_ac;
  Array<unsigned_char> local_a8;
  int local_94;
  EVP_CIPHER_CTX *local_90;
  HMAC_CTX *local_88;
  bssl *local_80;
  uchar local_78 [72];
  
  puVar7 = ticket.data_;
  local_88 = hmac_ctx;
  uVar4 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)out);
  uVar8 = (ulong)uVar4;
  len = (uchar *)HMAC_size((HMAC_CTX *)cipher_ctx);
  if (puVar7 < len + uVar8 + 0x11) {
    sVar6 = ssl_ticket_aead_ignore_ticket;
  }
  else {
    len_00 = (long)puVar7 - (long)len;
    local_90 = (EVP_CIPHER_CTX *)out;
    local_80 = this;
    if (puVar7 < len) {
LAB_002408a7:
      abort();
    }
    puVar7 = puVar7 + (long)local_88;
    HMAC_Update((HMAC_CTX *)cipher_ctx,(uchar *)local_88,len_00);
    HMAC_Final((HMAC_CTX *)cipher_ctx,local_78,(uint *)0x0);
    iVar5 = CRYPTO_memcmp(local_78,puVar7 + -(long)len,(size_t)len);
    pbVar2 = local_80;
    pHVar1 = local_88;
    sVar6 = ssl_ticket_aead_ignore_ticket;
    if (iVar5 == 0) {
      new_size = len_00 - (uVar8 + 0x10);
      if (len_00 < uVar8 + 0x10) goto LAB_002408a7;
      local_a8.data_ = (uchar *)0x0;
      local_a8.size_ = 0;
      if (new_size < 0x7fffffff) {
        bVar3 = Array<unsigned_char>::InitUninitialized(&local_a8,new_size);
        if (bVar3) {
          iVar5 = EVP_DecryptUpdate(local_90,local_a8.data_,&local_ac,
                                    (uchar *)((long)&(pHVar1->md_ctx).md_data + uVar8),(int)new_size
                                   );
          if ((iVar5 == 0) ||
             (iVar5 = EVP_DecryptFinal_ex(local_90,local_a8.data_ + local_ac,&local_94), iVar5 == 0)
             ) {
            ERR_clear_error();
          }
          else {
            if (local_a8.size_ < (ulong)((long)local_94 + (long)local_ac)) goto LAB_002408a7;
            local_a8.size_ = (long)local_94 + (long)local_ac;
            OPENSSL_free(*(void **)pbVar2);
            *(uchar **)pbVar2 = local_a8.data_;
            *(size_t *)(pbVar2 + 8) = local_a8.size_;
            local_a8.data_ = (uchar *)0x0;
            local_a8.size_ = 0;
            sVar6 = ssl_ticket_aead_success;
          }
        }
        else {
          sVar6 = ssl_ticket_aead_error;
        }
      }
      OPENSSL_free(local_a8.data_);
    }
  }
  return sVar6;
}

Assistant:

static enum ssl_ticket_aead_result_t decrypt_ticket_with_cipher_ctx(
    Array<uint8_t> *out, EVP_CIPHER_CTX *cipher_ctx, HMAC_CTX *hmac_ctx,
    Span<const uint8_t> ticket) {
  size_t iv_len = EVP_CIPHER_CTX_iv_length(cipher_ctx);

  // Check the MAC at the end of the ticket.
  uint8_t mac[EVP_MAX_MD_SIZE];
  size_t mac_len = HMAC_size(hmac_ctx);
  if (ticket.size() < SSL_TICKET_KEY_NAME_LEN + iv_len + 1 + mac_len) {
    // The ticket must be large enough for key name, IV, data, and MAC.
    return ssl_ticket_aead_ignore_ticket;
  }
  // Split the ticket into the ticket and the MAC.
  auto ticket_mac = ticket.last(mac_len);
  ticket = ticket.first(ticket.size() - mac_len);
  HMAC_Update(hmac_ctx, ticket.data(), ticket.size());
  HMAC_Final(hmac_ctx, mac, NULL);
  assert(mac_len == ticket_mac.size());
  bool mac_ok = CRYPTO_memcmp(mac, ticket_mac.data(), mac_len) == 0;
  if (CRYPTO_fuzzer_mode_enabled()) {
    mac_ok = true;
  }
  if (!mac_ok) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Decrypt the session data.
  auto ciphertext = ticket.subspan(SSL_TICKET_KEY_NAME_LEN + iv_len);
  Array<uint8_t> plaintext;
  if (CRYPTO_fuzzer_mode_enabled()) {
    if (!plaintext.CopyFrom(ciphertext)) {
      return ssl_ticket_aead_error;
    }
  } else {
    if (ciphertext.size() >= INT_MAX) {
      return ssl_ticket_aead_ignore_ticket;
    }
    if (!plaintext.InitForOverwrite(ciphertext.size())) {
      return ssl_ticket_aead_error;
    }
    int len1, len2;
    if (!EVP_DecryptUpdate(cipher_ctx, plaintext.data(), &len1,
                           ciphertext.data(), (int)ciphertext.size()) ||
        !EVP_DecryptFinal_ex(cipher_ctx, plaintext.data() + len1, &len2)) {
      ERR_clear_error();
      return ssl_ticket_aead_ignore_ticket;
    }
    plaintext.Shrink(static_cast<size_t>(len1) + len2);
  }

  *out = std::move(plaintext);
  return ssl_ticket_aead_success;
}